

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_select_into(void)

{
  mp_int *src0;
  mp_int *src1;
  mp_int *dest;
  size_t sVar1;
  ulong uVar2;
  
  src0 = mp_random_bits_fn(0x100,random_read);
  src1 = mp_random_bits_fn(0x200,random_read);
  dest = mp_new(0x180);
  sVar1 = (*looplimit)(0x10);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      mp_select_into(dest,src0,src1,(uint)uVar2 & 1);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(0x10);
    } while (uVar2 < sVar1);
  }
  mp_free(src0);
  mp_free(src1);
  mp_free(dest);
  return;
}

Assistant:

static void test_mp_select_into(void)
{
    mp_int *a = mp_random_bits(256);
    mp_int *b = mp_random_bits(512);
    mp_int *r = mp_new(384);
    for (size_t i = 0; i < looplimit(16); i++) {
        log_start();
        mp_select_into(r, a, b, i & 1);
        log_end();
    }
    mp_free(a);
    mp_free(b);
    mp_free(r);
}